

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

size_t calc_push_opcode_size(size_t n)

{
  size_t n_local;
  
  if (n < 0x4c) {
    n_local = 1;
  }
  else if (n < 0x100) {
    n_local = 2;
  }
  else if (n < 0x10000) {
    n_local = 3;
  }
  else {
    n_local = 5;
  }
  return n_local;
}

Assistant:

static size_t calc_push_opcode_size(size_t n)
{
    if (n < 76)
        return 1;
    else if (n < 256)
        return 2;
    else if (n < 65536)
        return 3;
    return 5;
}